

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void uxsel_tell(NetSocket *s)

{
  size_t sVar1;
  uint local_14;
  int rwx;
  NetSocket *s_local;
  
  local_14 = 0;
  if (s->pending_error == 0) {
    if ((s->listener & 1U) == 0) {
      if ((s->connected & 1U) == 0) {
        local_14 = 2;
      }
      if ((((s->connected & 1U) != 0) && ((s->frozen & 1U) == 0)) && ((s->incomingeof & 1U) == 0)) {
        local_14 = local_14 | 5;
      }
      sVar1 = bufchain_size(&s->output_data);
      if (sVar1 != 0) {
        local_14 = local_14 | 2;
      }
    }
    else {
      local_14 = 1;
    }
  }
  uxsel_set(s->s,local_14,net_select_result);
  return;
}

Assistant:

static void uxsel_tell(NetSocket *s)
{
    int rwx = 0;
    if (!s->pending_error) {
        if (s->listener) {
            rwx |= SELECT_R;           /* read == accept */
        } else {
            if (!s->connected)
                rwx |= SELECT_W;       /* write == connect */
            if (s->connected && !s->frozen && !s->incomingeof)
                rwx |= SELECT_R | SELECT_X;
            if (bufchain_size(&s->output_data))
                rwx |= SELECT_W;
        }
    }
    uxsel_set(s->s, rwx, net_select_result);
}